

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_args.c
# Opt level: O1

int mpt_config_args(mpt_config *cfg,mpt_iterator *args,mpt_logger *info)

{
  mpt_type_t type;
  undefined8 *puVar1;
  bool bVar2;
  uint in_EAX;
  int iVar3;
  uint uVar4;
  mpt_value *pmVar5;
  char *pcVar6;
  char cVar7;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  mpt_property pr;
  mpt_path p;
  void *ptr;
  char *local_98;
  undefined8 uStack_90;
  mpt_value local_88;
  char *local_78;
  undefined8 uStack_70;
  mpt_path local_68;
  mpt_config *local_40;
  long *local_38;
  
  local_68.len = 0;
  local_68.first = '\0';
  local_68.flags = '\0';
  local_68.sep = '.';
  local_68.assign = '\0';
  local_68._28_4_ = 0;
  local_68.base._0_4_ = 0;
  local_68.base._4_4_ = 0;
  local_68.off._0_4_ = 0;
  local_68.off._4_4_ = 0;
  if (args == (mpt_iterator *)0x0) {
    uVar4 = (*cfg->_vptr->assign)(cfg,&local_68,(mpt_value *)0x0);
    uVar10 = 0;
    if (((int)uVar4 < 0) && (uVar10 = uVar4, info != (mpt_logger *)0x0)) {
      mpt_log(info,"mpt_config_args",3,"%s","unable to set default config");
    }
  }
  else {
    uVar10 = 0;
    local_40 = cfg;
    do {
      local_78 = (char *)0x0;
      uStack_70 = 0;
      local_88._addr = (char **)0x0;
      local_88._type = 0;
      local_98 = (char *)0x0;
      uStack_90 = 0;
      pmVar5 = (*args->_vptr->value)(args);
      if ((pmVar5 == (mpt_value *)0x0) ||
         (local_38 = (long *)pmVar5->_addr, local_38 == (long *)0x0)) {
        if (info == (mpt_logger *)0x0) {
LAB_0010b8a3:
          cVar7 = '\x03';
        }
        else {
          cVar7 = '\x03';
          mpt_log(info,"mpt_config_args",3,"%s","unable to set default config");
        }
      }
      else {
        type = pmVar5->_type;
        if (((type == 0x80) || (type == 0x801)) || (type - 0x100 < 0x700)) {
          puVar1 = (undefined8 *)*local_38;
          if (puVar1 == (undefined8 *)0x0) {
            if (info != (mpt_logger *)0x0) {
              pcVar8 = "missing convertable pointer";
              goto LAB_0010b7e4;
            }
LAB_0010b7b5:
            cVar7 = '\x03';
            bVar2 = false;
          }
          else {
            iVar3 = (**(code **)*puVar1)(puVar1,0x1a,&local_98);
            if ((iVar3 < 0) || (local_88._type == 0)) {
              iVar3 = (**(code **)*puVar1)(puVar1,0x73,&local_98);
              if (iVar3 < 0) {
                if (info == (mpt_logger *)0x0) goto LAB_0010b7b5;
                pcVar8 = "invalid assinment";
              }
              else {
                bVar2 = local_98 != (char *)0x0;
                if (info == (mpt_logger *)0x0 || bVar2) {
                  cVar7 = (local_98 == (char *)0x0) * '\x03';
                  goto LAB_0010b7eb;
                }
                pcVar8 = "invalid property name";
              }
LAB_0010b7e4:
              bVar2 = false;
              cVar7 = '\x03';
              mpt_log(info,"mpt_config_args",3,"%s",pcVar8);
            }
            else {
              local_68.assign = '\0';
              mpt_path_set(&local_68,local_98,-1);
              cVar7 = '\0';
              bVar2 = true;
            }
          }
LAB_0010b7eb:
          if (!bVar2) goto LAB_0010b966;
        }
        else {
          local_98 = mpt_data_tostring(&local_38,type,(size_t *)0x0);
          if (local_98 == (char *)0x0) {
            cVar7 = '\x03';
            if (info != (mpt_logger *)0x0) {
              uVar10 = uVar10 + 1;
              mpt_log(info,"mpt_config_args",4,"%s: %d (%d)","bad string value",(ulong)uVar10,
                      pmVar5->_type);
            }
            goto LAB_0010b966;
          }
        }
        pcVar8 = local_98;
        if (local_88._type == 0) {
          pcVar6 = strchr(local_98,0x3d);
          if (pcVar6 != (char *)0x0) {
            local_68.assign = '=';
            mpt_path_set(&local_68,pcVar8,(int)pcVar6 - (int)pcVar8);
            local_88._type = 0x73;
            local_78 = pcVar6 + 1;
            local_88._addr = &local_78;
            goto LAB_0010b84c;
          }
          cVar7 = '\x03';
          if (info == (mpt_logger *)0x0) goto LAB_0010b966;
          iVar3 = 4;
          pcVar6 = "%s: %s";
          pcVar9 = "missing path separator";
LAB_0010b958:
          cVar7 = '\x03';
          mpt_log(info,"mpt_config_args",iVar3,pcVar6,pcVar9,pcVar8);
        }
        else {
LAB_0010b84c:
          if (local_98 == (char *)0x0) {
            if (info != (mpt_logger *)0x0) {
              uVar10 = uVar10 + 1;
              mpt_log(info,"mpt_config_args",4,"%s: %d","missing config path",(ulong)uVar10);
            }
            uVar4 = 0xfffffffd;
          }
          else {
            iVar3 = (*local_40->_vptr->assign)(local_40,&local_68,&local_88);
            if (-1 < iVar3) {
              if (info != (mpt_logger *)0x0) {
                mpt_log(info,"mpt_config_args",0x14,"%s: %s","element assiged",local_98);
                goto LAB_0010b8a3;
              }
              uVar10 = uVar10 + 1;
              cVar7 = '\0';
              goto LAB_0010b966;
            }
            if (info != (mpt_logger *)0x0) {
              pcVar8 = (char *)pmVar5->_type;
              uVar10 = uVar10 + 1;
              iVar3 = 3;
              pcVar6 = "%s (%d): %d";
              pcVar9 = "config assign error";
              goto LAB_0010b958;
            }
            uVar4 = 0xfffffffe;
          }
          in_EAX = uVar10;
          if (uVar10 == 0) {
            in_EAX = uVar4;
          }
          cVar7 = '\x01';
        }
      }
LAB_0010b966:
      if ((cVar7 != '\x03') && (cVar7 != '\0')) {
        return in_EAX;
      }
      iVar3 = (*args->_vptr->advance)(args);
    } while (0 < iVar3);
    if (iVar3 == 0) {
      uVar10 = 0;
    }
  }
  return uVar10;
}

Assistant:

extern int mpt_config_args(MPT_INTERFACE(config) *cfg, MPT_INTERFACE(iterator) *args, MPT_INTERFACE(logger) *info)
{
	MPT_STRUCT(path) p = MPT_PATH_INIT;
	
	int res, count, err;
	
	if (!args) {
		res = cfg->_vptr->assign(cfg, &p, 0);
		if (res < 0) {
			if (info) {
				mpt_log(info, __func__, MPT_LOG(Error), "%s",
				        MPT_tr("unable to set default config"));
			}
			return res;
		}
		return 0;
	}
	err = 0;
	count = 0;
	do {
		MPT_STRUCT(property) pr = MPT_PROPERTY_INIT;
		const MPT_STRUCT(value) *val = args->_vptr->value(args);
		const void *ptr;
		const char *end;
		
		if (!val || !(ptr = val->_addr)) {
			if (info) {
				mpt_log(info, __func__, MPT_LOG(Error), "%s",
				        MPT_tr("unable to set default config"));
			}
			continue;
		}
		if (MPT_type_isConvertable(val->_type)) {
			MPT_INTERFACE(convertable) *conv;
			
			if (!(conv = *((void * const *) ptr))) {
				if (info) {
					mpt_log(info, __func__, MPT_LOG(Error), "%s",
					        MPT_tr("missing convertable pointer"));
				}
				continue;
			}
			/* get assign target */
			else if ((res = conv->_vptr->convert(conv, MPT_ENUM(TypeProperty), &pr)) >= 0 && pr.val._type) {
				p.assign = 0;
				mpt_path_set(&p, pr.name, -1);
			}
			else if ((res = conv->_vptr->convert(conv, 's', &pr.name)) < 0) {
				if (info) {
					mpt_log(info, __func__, MPT_LOG(Error), "%s",
					        MPT_tr("invalid assinment"));
				}
				continue;
			}
			else if (!pr.name) {
				if (info) {
					mpt_log(info, __func__, MPT_LOG(Error), "%s",
					        MPT_tr("invalid property name"));
				}
				continue;
			}
		}
		else if (!(pr.name = mpt_data_tostring(&ptr, val->_type, 0))) {
			if (info) {
				mpt_log(info, __func__, MPT_LOG(Warning), "%s: %d (%d)",
				        MPT_tr("bad string value"), ++count, val->_type);
			}
			continue;
		}
		/* no property type assigned */
		if (!pr.val._type) {
			if (!(end = strchr(pr.name, '='))) {
				++err;
				if (info) {
					mpt_log(info, __func__, MPT_LOG(Warning), "%s: %s",
					        MPT_tr("missing path separator"), pr.name);
				}
				continue;
			}
			p.assign = '=';
			mpt_path_set(&p, pr.name, end - pr.name);
			MPT_property_set_string(&pr, end + 1);
		}
		/* no top level assign */
		if (!pr.name) {
			++err;
			if (info) {
				mpt_log(info, __func__, MPT_LOG(Warning), "%s: %d",
				        MPT_tr("missing config path"), ++count);
			}
			return count ? count : MPT_ERROR(BadType);
		}
		/* assign config */
		if (cfg->_vptr->assign(cfg, &p, &pr.val) < 0) {
			++err;
			if (info) {
				mpt_log(info, __func__, MPT_LOG(Error), "%s (%d): %d",
				        MPT_tr("config assign error"), val->_type, ++count);
				continue;
			}
			return count ? count : MPT_ERROR(BadValue);
		}
		if (info) {
			mpt_log(info, __func__, MPT_LOG(Debug2), "%s: %s",
			        MPT_tr("element assiged"), pr.name);
			continue;
		}
		++count;
	} while ((res = args->_vptr->advance(args)) > 0);
	
	return res ? count : 0;
}